

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::anon_unknown_0::ParseErrorTest_EnumReservedNegativeNumberOutOfRange_Test
::TestBody(ParseErrorTest_EnumReservedNegativeNumberOutOfRange_Test *this)

{
  string_view text;
  MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  MStack_28;
  
  testing::Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Matcher((Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&MStack_28,"2:12: Integer out of range.\n");
  text._M_str = "enum TestEnum {\nFOO = 1;\n  reserved -2147483649;\n}\n";
  text._M_len = 0x33;
  ParserTest::ExpectHasErrors
            (&this->super_ParseErrorTest,text,
             (Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&MStack_28);
  testing::internal::
  MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~MatcherBase(&MStack_28);
  return;
}

Assistant:

TEST_F(ParseErrorTest, EnumReservedNegativeNumberOutOfRange) {
  ExpectHasErrors(
      "enum TestEnum {\n"
      "FOO = 1;\n"
      "  reserved -2147483649;\n"
      "}\n",
      "2:12: Integer out of range.\n");
}